

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall TTD::TTEventList::AddArrayLink(TTEventList *this)

{
  TTEventListLink *pTVar1;
  uchar *puVar2;
  TTEventListLink *newHeadBlock;
  TTEventList *this_local;
  
  pTVar1 = SlabAllocatorBase<8>::SlabAllocateStruct<TTD::TTEventList::TTEventListLink>
                     (this->m_alloc);
  puVar2 = SlabAllocatorBase<8>::SlabAllocateFixedSizeArray<unsigned_char,65536ul>(this->m_alloc);
  pTVar1->BlockData = puVar2;
  memset(pTVar1->BlockData,0,0x10000);
  pTVar1->CurrPos = 0;
  pTVar1->StartPos = 0;
  pTVar1->Next = (TTEventListLink *)0x0;
  pTVar1->Previous = this->m_headBlock;
  if (this->m_headBlock != (TTEventListLink *)0x0) {
    this->m_headBlock->Next = pTVar1;
  }
  this->m_headBlock = pTVar1;
  return;
}

Assistant:

void TTEventList::AddArrayLink()
    {
        TTEventListLink* newHeadBlock = this->m_alloc->SlabAllocateStruct<TTEventListLink>();
        newHeadBlock->BlockData = this->m_alloc->SlabAllocateFixedSizeArray<byte, TTD_EVENTLOG_LIST_BLOCK_SIZE>();
        memset(newHeadBlock->BlockData, 0, TTD_EVENTLOG_LIST_BLOCK_SIZE);

        newHeadBlock->CurrPos = 0;
        newHeadBlock->StartPos = 0;

        newHeadBlock->Next = nullptr;
        newHeadBlock->Previous = this->m_headBlock;

        if(this->m_headBlock != nullptr)
        {
            this->m_headBlock->Next = newHeadBlock;
        }

        this->m_headBlock = newHeadBlock;
    }